

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86.cpp
# Opt level: O0

int __thiscall ncnn::Mish_x86::forward_inplace(Mish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  long *in_RSI;
  float fVar24;
  float fVar25;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar26 [16];
  float fVar31;
  float fVar32;
  int iVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  __m128 _p_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int d;
  int h;
  int w;
  Mat *m_1;
  Mat *m;
  __m128 two;
  __m128 one_2;
  __m128 two_1;
  __m128 one_7;
  v4sf y_1;
  v4sf z;
  v4sf tmp_1;
  v4sf mask_1;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_1;
  v4si emm0_1;
  v4sf y_4;
  v4sf z_1;
  v4sf tmp_4;
  v4sf mask_4;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_6;
  v4si emm0_4;
  v4sf pow2n;
  v4sf y;
  v4sf mask;
  v4sf one;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_5;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  __m128 one_8;
  v4sf pow2n_3;
  v4sf y_5;
  v4sf mask_5;
  v4sf one_9;
  v4si emm0_5;
  v4sf fx_3;
  v4sf tmp_5;
  __m128 one_3;
  v4sf pow2n_1;
  v4sf y_2;
  v4sf mask_2;
  v4sf one_4;
  v4si emm0_2;
  v4sf fx_1;
  v4sf tmp_2;
  undefined8 local_2a78;
  undefined8 uStack_2a70;
  int local_2a64;
  undefined8 local_2a60;
  undefined8 local_2a58;
  undefined8 local_2a50;
  undefined4 local_2a48;
  long local_2a40;
  undefined4 local_2a38;
  undefined4 local_2a34;
  undefined4 local_2a30;
  undefined4 local_2a2c;
  undefined4 local_2a28;
  undefined8 local_2a20;
  undefined1 (*local_2a18) [16];
  int local_2a0c;
  undefined8 local_2a08;
  undefined8 uStack_2a00;
  int local_29f8;
  undefined1 (*local_29a0) [16];
  int local_2994;
  int local_2990;
  int local_298c;
  int local_2988;
  int local_2984;
  int local_2980;
  int local_297c;
  long *local_2970;
  undefined1 local_2955;
  int local_2954;
  undefined8 *local_2948;
  undefined8 *local_2928;
  undefined8 *local_28f8;
  undefined1 (*local_28e8) [16];
  undefined8 local_28d8;
  undefined8 uStack_28d0;
  undefined8 local_28b8;
  undefined8 uStack_28b0;
  undefined1 (*local_28a0) [16];
  long local_2840;
  undefined4 local_2834;
  long local_2830;
  undefined1 (*local_2828) [16];
  undefined4 local_281c;
  int local_2818;
  int local_2814;
  undefined8 *local_2810;
  undefined4 local_2804;
  long local_2800;
  undefined8 *local_27d0;
  float local_2748;
  float fStack_2744;
  float fStack_2740;
  float fStack_273c;
  float local_2738;
  float fStack_2734;
  float fStack_2730;
  float fStack_272c;
  undefined8 local_2728;
  undefined8 uStack_2720;
  float local_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  float local_26b8;
  float fStack_26b4;
  float fStack_26b0;
  float fStack_26ac;
  undefined8 local_26a8;
  undefined8 uStack_26a0;
  undefined8 local_2698;
  undefined8 uStack_2690;
  ulong local_2688;
  ulong uStack_2680;
  undefined8 local_2678;
  undefined8 uStack_2670;
  undefined1 local_2668 [8];
  float fStack_2660;
  float fStack_265c;
  undefined8 local_2658;
  undefined8 uStack_2650;
  undefined8 local_2648;
  undefined8 uStack_2640;
  undefined8 local_25b8;
  undefined8 uStack_25b0;
  undefined8 local_2548;
  undefined8 uStack_2540;
  float local_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  ulong local_2528;
  ulong uStack_2520;
  int local_2518;
  int iStack_2514;
  int iStack_2510;
  int iStack_250c;
  float local_2508;
  float fStack_2504;
  float fStack_2500;
  float fStack_24fc;
  int local_24f8;
  int iStack_24f4;
  int iStack_24f0;
  int iStack_24ec;
  undefined8 local_24e8;
  undefined8 uStack_24e0;
  int local_24d8;
  int iStack_24d4;
  int iStack_24d0;
  int iStack_24cc;
  undefined8 local_24c8;
  undefined8 uStack_24c0;
  undefined8 local_24b8;
  undefined8 uStack_24b0;
  undefined8 local_24a8;
  undefined8 uStack_24a0;
  undefined8 local_2498;
  undefined8 uStack_2490;
  undefined8 local_2488;
  undefined8 uStack_2480;
  undefined8 local_2478;
  undefined8 uStack_2470;
  undefined8 local_2468;
  undefined8 uStack_2460;
  undefined8 local_2458;
  undefined8 uStack_2450;
  undefined8 local_2448;
  undefined8 uStack_2440;
  undefined8 local_2438;
  undefined8 uStack_2430;
  undefined8 local_2428;
  undefined8 uStack_2420;
  undefined8 local_2418;
  undefined8 uStack_2410;
  undefined8 local_2408;
  undefined8 uStack_2400;
  float local_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  undefined8 local_2378;
  undefined8 uStack_2370;
  undefined8 local_2368;
  undefined8 uStack_2360;
  undefined8 local_2338;
  undefined8 uStack_2330;
  float local_2288;
  float fStack_2284;
  float fStack_2280;
  float fStack_227c;
  undefined8 local_2238;
  undefined8 uStack_2230;
  undefined8 local_2228;
  undefined8 uStack_2220;
  undefined8 local_2218;
  undefined8 uStack_2210;
  undefined8 local_2208;
  undefined8 uStack_2200;
  float local_21f8;
  float fStack_21f4;
  float fStack_21f0;
  float fStack_21ec;
  float local_21e8;
  float fStack_21e4;
  float fStack_21e0;
  float fStack_21dc;
  undefined8 local_21d8;
  undefined8 uStack_21d0;
  undefined8 local_21c8;
  undefined8 uStack_21c0;
  undefined8 local_21b8;
  undefined8 uStack_21b0;
  undefined8 local_21a8;
  undefined8 uStack_21a0;
  undefined8 local_2198;
  undefined8 uStack_2190;
  undefined8 local_2188;
  undefined8 uStack_2180;
  undefined8 local_2178;
  undefined8 uStack_2170;
  undefined8 local_2168;
  undefined8 uStack_2160;
  undefined8 local_2158;
  undefined8 uStack_2150;
  undefined8 local_2148;
  undefined8 uStack_2140;
  undefined8 local_2138;
  undefined8 uStack_2130;
  undefined8 local_2128;
  undefined8 uStack_2120;
  undefined4 local_2118;
  undefined4 uStack_2114;
  undefined4 uStack_2110;
  undefined4 uStack_210c;
  undefined4 local_20fc;
  undefined4 local_20f8;
  undefined4 uStack_20f4;
  undefined4 uStack_20f0;
  undefined4 uStack_20ec;
  undefined4 local_20dc;
  undefined4 local_2078;
  undefined4 uStack_2074;
  undefined4 uStack_2070;
  undefined4 uStack_206c;
  undefined4 local_205c;
  undefined8 local_2058;
  undefined8 uStack_2050;
  undefined8 local_2048;
  undefined8 uStack_2040;
  float local_2038;
  float fStack_2034;
  float fStack_2030;
  float fStack_202c;
  undefined8 local_2018;
  undefined8 uStack_2010;
  undefined8 local_2008;
  undefined8 uStack_2000;
  undefined8 local_1ff8;
  undefined8 uStack_1ff0;
  ulong local_1fe8;
  ulong uStack_1fe0;
  float local_1fd8;
  float fStack_1fd4;
  float fStack_1fd0;
  float fStack_1fcc;
  undefined8 local_1f98;
  undefined8 uStack_1f90;
  float local_1f88;
  float fStack_1f84;
  float fStack_1f80;
  float fStack_1f7c;
  undefined8 local_1f58;
  undefined8 uStack_1f50;
  float local_1f48;
  float fStack_1f44;
  float fStack_1f40;
  float fStack_1f3c;
  undefined8 local_1f38;
  undefined8 uStack_1f30;
  undefined8 local_1f28;
  undefined8 uStack_1f20;
  undefined8 local_1f18;
  undefined8 uStack_1f10;
  undefined8 local_1f08;
  undefined8 uStack_1f00;
  undefined8 local_1ef8;
  undefined8 uStack_1ef0;
  undefined8 local_1ee8;
  undefined8 uStack_1ee0;
  float local_1ed8;
  float fStack_1ed4;
  float fStack_1ed0;
  float fStack_1ecc;
  float local_1ec8;
  float fStack_1ec4;
  float fStack_1ec0;
  float fStack_1ebc;
  float local_1eb8;
  float fStack_1eb4;
  float fStack_1eb0;
  float fStack_1eac;
  undefined8 local_1ea8;
  undefined8 uStack_1ea0;
  undefined8 local_1e98;
  undefined8 uStack_1e90;
  undefined8 local_1e88;
  undefined8 uStack_1e80;
  undefined8 local_1e78;
  undefined8 uStack_1e70;
  undefined8 local_1e68;
  undefined8 uStack_1e60;
  undefined8 local_1e58;
  undefined8 uStack_1e50;
  undefined8 local_1e48;
  undefined8 uStack_1e40;
  undefined8 local_1e38;
  undefined8 uStack_1e30;
  undefined8 local_1e28;
  undefined8 uStack_1e20;
  undefined8 local_1e18;
  undefined8 uStack_1e10;
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  undefined4 local_1df8;
  undefined4 uStack_1df4;
  undefined4 uStack_1df0;
  undefined4 uStack_1dec;
  undefined4 local_1ddc;
  undefined8 local_1dd8;
  undefined8 uStack_1dd0;
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  undefined8 local_1db8;
  undefined8 uStack_1db0;
  undefined8 local_1da8;
  undefined8 uStack_1da0;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  undefined8 local_1ce8;
  undefined8 uStack_1ce0;
  float local_1c88;
  float fStack_1c84;
  float fStack_1c80;
  float fStack_1c7c;
  float local_1c18;
  float fStack_1c14;
  float fStack_1c10;
  float fStack_1c0c;
  float local_1bb8;
  float fStack_1bb4;
  float fStack_1bb0;
  float fStack_1bac;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined4 local_1a0c;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  uint local_19e8;
  uint uStack_19e4;
  uint uStack_19e0;
  uint uStack_19dc;
  ulong local_19d8;
  ulong uStack_19d0;
  undefined8 local_1998;
  undefined8 uStack_1990;
  ulong local_1988;
  ulong uStack_1980;
  undefined8 local_1978;
  undefined8 uStack_1970;
  ulong local_1968;
  ulong uStack_1960;
  ulong local_1938;
  ulong uStack_1930;
  undefined8 local_1928;
  undefined8 uStack_1920;
  ulong local_1918;
  ulong uStack_1910;
  ulong local_1908;
  ulong uStack_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  ulong local_18e8;
  ulong uStack_18e0;
  ulong local_1878;
  ulong uStack_1870;
  ulong local_1868;
  ulong uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  ulong local_1848;
  ulong uStack_1840;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  undefined8 *local_14d0;
  float *local_14c8;
  undefined8 *local_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  float local_1488;
  float fStack_1484;
  float fStack_1480;
  float fStack_147c;
  float *local_1470;
  undefined8 *local_1468;
  undefined8 *local_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  float local_1438 [2];
  float afStack_1430 [2];
  float local_1428;
  float fStack_1424;
  float fStack_1420;
  float fStack_141c;
  float *local_1410;
  undefined8 *local_1408;
  undefined8 *local_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  float local_13d8 [2];
  float afStack_13d0 [2];
  float local_13c8;
  float fStack_13c4;
  float fStack_13c0;
  float fStack_13bc;
  float *local_13b0;
  undefined8 *local_13a8;
  undefined8 *local_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  float local_1378 [2];
  float afStack_1370 [2];
  float local_1368;
  float fStack_1364;
  float fStack_1360;
  float fStack_135c;
  float *local_1350;
  undefined8 *local_1348;
  undefined8 *local_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  float local_1318 [2];
  float afStack_1310 [2];
  float local_1308;
  float fStack_1304;
  float fStack_1300;
  float fStack_12fc;
  float *local_12f0;
  undefined8 *local_12e8;
  undefined8 *local_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  float local_12b8 [2];
  float afStack_12b0 [2];
  float local_12a8;
  float fStack_12a4;
  float fStack_12a0;
  float fStack_129c;
  undefined8 *local_1290;
  undefined8 *local_1288;
  undefined8 *local_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  float local_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  float *local_1230;
  undefined8 *local_1228;
  undefined8 *local_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  float local_11f8 [2];
  float afStack_11f0 [2];
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  float *local_11d0;
  undefined8 *local_11c8;
  undefined8 *local_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  float local_1198 [2];
  float afStack_1190 [2];
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  float *local_1170;
  undefined8 *local_1168;
  undefined8 *local_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  float local_1138 [2];
  float afStack_1130 [2];
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float *local_1110;
  undefined8 *local_1108;
  undefined8 *local_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  float local_10d8 [2];
  float afStack_10d0 [2];
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float *local_10b0;
  undefined8 *local_10a8;
  undefined8 *local_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  float local_1078 [2];
  float afStack_1070 [2];
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  undefined8 *local_e10;
  float *local_e08;
  float *local_e00;
  float local_df8 [2];
  float afStack_df0 [2];
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  float local_dc8;
  float fStack_dc4;
  float fStack_dc0;
  float fStack_dbc;
  undefined8 *local_db0;
  float *local_da8;
  float *local_da0;
  float local_d98 [2];
  float afStack_d90 [2];
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  float local_d68;
  float fStack_d64;
  float fStack_d60;
  float fStack_d5c;
  float *local_d50;
  undefined8 *local_d48;
  undefined8 *local_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  float local_d18 [2];
  float afStack_d10 [2];
  float local_d08;
  float fStack_d04;
  float fStack_d00;
  float fStack_cfc;
  float *local_cf0;
  undefined8 *local_ce8;
  undefined8 *local_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  float local_cb8 [2];
  float afStack_cb0 [2];
  float local_ca8;
  float fStack_ca4;
  float fStack_ca0;
  float fStack_c9c;
  float *local_c90;
  undefined8 *local_c88;
  undefined8 *local_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  float local_c58 [2];
  float afStack_c50 [2];
  float local_c48;
  float fStack_c44;
  float fStack_c40;
  float fStack_c3c;
  float *local_c30;
  undefined8 *local_c28;
  undefined8 *local_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  float local_bf8 [2];
  float afStack_bf0 [2];
  float local_be8;
  float fStack_be4;
  float fStack_be0;
  float fStack_bdc;
  float *local_bd0;
  undefined8 *local_bc8;
  undefined8 *local_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  float local_b98 [2];
  float afStack_b90 [2];
  float local_b88;
  float fStack_b84;
  float fStack_b80;
  float fStack_b7c;
  float *local_b70;
  undefined8 *local_b68;
  undefined8 *local_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  float local_b38 [2];
  float afStack_b30 [2];
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  float *local_b10;
  undefined8 *local_b08;
  undefined8 *local_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  float local_ad8 [2];
  float afStack_ad0 [2];
  float local_ac8;
  float fStack_ac4;
  float fStack_ac0;
  float fStack_abc;
  float *local_ab0;
  undefined8 *local_aa8;
  undefined8 *local_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  float local_a78 [2];
  float afStack_a70 [2];
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  undefined8 *local_5d0;
  float *local_5c8;
  float *local_5c0;
  float local_5b8 [2];
  float afStack_5b0 [2];
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 *local_570;
  float *local_568;
  float *local_560;
  float local_558 [2];
  float afStack_550 [2];
  undefined8 local_548;
  undefined8 uStack_540;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 *local_510;
  float *local_508;
  float *local_500;
  float local_4f8 [2];
  float afStack_4f0 [2];
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 *local_4b0;
  float *local_4a8;
  float *local_4a0;
  float local_498 [2];
  float afStack_490 [2];
  undefined8 local_488;
  undefined8 uStack_480;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 *local_390;
  float *local_388;
  float *local_380;
  float local_378 [2];
  float afStack_370 [2];
  undefined8 local_368;
  undefined8 uStack_360;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_297c = *(int *)((long)in_RSI + 0x2c);
  local_2980 = (int)in_RSI[6];
  local_2984 = *(int *)((long)in_RSI + 0x34);
  local_2988 = (int)in_RSI[7];
  local_298c = local_297c * local_2980 * local_2984;
  local_2990 = (int)in_RSI[3];
  if (local_2990 == 4) {
    for (local_2994 = 0; local_2994 < local_2988; local_2994 = local_2994 + 1) {
      local_29a0 = (undefined1 (*) [16])(*in_RSI + in_RSI[8] * (long)local_2994 * in_RSI[2]);
      for (local_29f8 = 0; local_29f8 < local_298c; local_29f8 = local_29f8 + 1) {
        auVar23._8_8_ = 0x42b0c0a542b0c0a5;
        auVar23._0_8_ = 0x42b0c0a542b0c0a5;
        auVar26 = minps(*local_29a0,auVar23);
        auVar13._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar13._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar26 = maxps(auVar26,auVar13);
        local_2288 = auVar26._0_4_;
        fStack_2284 = auVar26._4_4_;
        fStack_2280 = auVar26._8_4_;
        fStack_227c = auVar26._12_4_;
        fVar24 = local_2288 * 1.442695 + 0.5;
        fVar27 = fStack_2284 * 1.442695 + 0.5;
        fVar29 = fStack_2280 * 1.442695 + 0.5;
        fVar31 = fStack_227c * 1.442695 + 0.5;
        fVar25 = (float)(int)fVar24;
        fVar28 = (float)(int)fVar27;
        fVar30 = (float)(int)fVar29;
        fVar32 = (float)(int)fVar31;
        local_2338 = CONCAT44(-(uint)(fVar27 < fVar28),-(uint)(fVar24 < fVar25));
        uStack_2330 = CONCAT44(-(uint)(fVar31 < fVar32),-(uint)(fVar29 < fVar30));
        local_2038 = (float)(local_2338 & 0x3f8000003f800000);
        fStack_2034 = (float)((local_2338 & 0x3f8000003f800000) >> 0x20);
        fStack_2030 = (float)(uStack_2330 & 0x3f8000003f800000);
        fStack_202c = (float)((uStack_2330 & 0x3f8000003f800000) >> 0x20);
        fVar25 = fVar25 - local_2038;
        fVar28 = fVar28 - fStack_2034;
        fVar30 = fVar30 - fStack_2030;
        fVar32 = fVar32 - fStack_202c;
        fVar24 = (local_2288 - fVar25 * 0.6933594) - fVar25 * -0.00021219444;
        fVar27 = (fStack_2284 - fVar28 * 0.6933594) - fVar28 * -0.00021219444;
        fVar29 = (fStack_2280 - fVar30 * 0.6933594) - fVar30 * -0.00021219444;
        fVar31 = (fStack_227c - fVar32 * 0.6933594) - fVar32 * -0.00021219444;
        fVar24 = ((((((fVar24 * 0.00019875691 + 0.0013981999) * fVar24 + 0.008333452) * fVar24 +
                    0.041665796) * fVar24 + 0.16666666) * fVar24 + 0.5) * fVar24 * fVar24 + fVar24 +
                 1.0) * (float)(((int)fVar25 + 0x7f) * 0x800000) + 1.0;
        fVar25 = ((((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
                    0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5) * fVar27 * fVar27 + fVar27 +
                 1.0) * (float)((int)fVar28 + 0x7f) + 1.0;
        fVar27 = ((((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
                    0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5) * fVar29 * fVar29 + fVar29 +
                 1.0) * (float)((int)fVar30 + 0x7f) + 1.0;
        fVar28 = ((((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31 +
                    0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5) * fVar31 * fVar31 + fVar31 +
                 1.0) * (float)((int)fVar32 + 0x7f) + 1.0;
        local_25b8 = CONCAT44(fVar25,fVar24);
        uStack_25b0._0_4_ = fVar27;
        uStack_25b0._4_4_ = fVar28;
        auVar17._8_8_ = uStack_25b0;
        auVar17._0_8_ = local_25b8;
        auVar16._8_8_ = 0x80000000800000;
        auVar16._0_8_ = 0x80000000800000;
        auVar26 = maxps(auVar17,auVar16);
        local_25b8 = auVar26._0_8_;
        uStack_25b0 = auVar26._8_8_;
        local_19e8 = auVar26._0_4_;
        uStack_19e4 = auVar26._4_4_;
        uStack_19e0 = auVar26._8_4_;
        uStack_19dc = auVar26._12_4_;
        uVar34 = local_25b8 & 0x807fffff807fffff | 0x3f0000003f000000;
        uVar36 = uStack_25b0 & 0x807fffff807fffff | 0x3f0000003f000000;
        local_1728 = (float)uVar34;
        fStack_1724 = (float)(uVar34 >> 0x20);
        fStack_1720 = (float)uVar36;
        fStack_171c = (float)(uVar36 >> 0x20);
        uVar34 = uVar34 & CONCAT44(-(uint)(fStack_1724 < 0.70710677),
                                   -(uint)(local_1728 < 0.70710677));
        uVar36 = uVar36 & CONCAT44(-(uint)(fStack_171c < 0.70710677),
                                   -(uint)(fStack_1720 < 0.70710677));
        uVar35 = CONCAT44(-(uint)(fStack_1724 < 0.70710677),-(uint)(local_1728 < 0.70710677)) &
                 0x3f8000003f800000;
        uVar37 = CONCAT44(-(uint)(fStack_171c < 0.70710677),-(uint)(fStack_1720 < 0.70710677)) &
                 0x3f8000003f800000;
        local_1fd8 = (float)uVar35;
        fStack_1fd4 = (float)(uVar35 >> 0x20);
        fStack_1fd0 = (float)uVar37;
        fStack_1fcc = (float)(uVar37 >> 0x20);
        local_1fd8 = ((float)(int)((local_19e8 >> 0x17) - 0x7f) + 1.0) - local_1fd8;
        fStack_1fd4 = ((float)(int)((uStack_19e4 >> 0x17) - 0x7f) + 1.0) - fStack_1fd4;
        fStack_1fd0 = ((float)(int)((uStack_19e0 >> 0x17) - 0x7f) + 1.0) - fStack_1fd0;
        fStack_1fcc = ((float)(int)((uStack_19dc >> 0x17) - 0x7f) + 1.0) - fStack_1fcc;
        local_23d8 = (float)uVar34;
        fStack_23d4 = (float)(uVar34 >> 0x20);
        fStack_23d0 = (float)uVar36;
        fStack_23cc = (float)(uVar36 >> 0x20);
        local_23d8 = (local_1728 - 1.0) + local_23d8;
        fStack_23d4 = (fStack_1724 - 1.0) + fStack_23d4;
        fStack_23d0 = (fStack_1720 - 1.0) + fStack_23d0;
        fStack_23cc = (fStack_171c - 1.0) + fStack_23cc;
        local_25b8 = CONCAT44(fStack_1fd4 * 0.6933594 +
                              fStack_23d4 +
                              ((fStack_1fd4 * -0.00021219444 +
                               ((((((((fStack_23d4 * 0.070376836 + -0.1151461) * fStack_23d4 +
                                     0.116769984) * fStack_23d4 + -0.12420141) * fStack_23d4 +
                                   0.14249323) * fStack_23d4 + -0.16668057) * fStack_23d4 +
                                 0.20000714) * fStack_23d4 + -0.24999994) * fStack_23d4 + 0.3333333)
                               * fStack_23d4 * fStack_23d4 * fStack_23d4) -
                              fStack_23d4 * fStack_23d4 * 0.5),
                              local_1fd8 * 0.6933594 +
                              local_23d8 +
                              ((local_1fd8 * -0.00021219444 +
                               ((((((((local_23d8 * 0.070376836 + -0.1151461) * local_23d8 +
                                     0.116769984) * local_23d8 + -0.12420141) * local_23d8 +
                                   0.14249323) * local_23d8 + -0.16668057) * local_23d8 + 0.20000714
                                 ) * local_23d8 + -0.24999994) * local_23d8 + 0.3333333) *
                               local_23d8 * local_23d8 * local_23d8) - local_23d8 * local_23d8 * 0.5
                              ));
        uStack_25b0._0_4_ =
             fStack_1fd0 * 0.6933594 +
             fStack_23d0 +
             ((fStack_1fd0 * -0.00021219444 +
              ((((((((fStack_23d0 * 0.070376836 + -0.1151461) * fStack_23d0 + 0.116769984) *
                    fStack_23d0 + -0.12420141) * fStack_23d0 + 0.14249323) * fStack_23d0 +
                 -0.16668057) * fStack_23d0 + 0.20000714) * fStack_23d0 + -0.24999994) * fStack_23d0
              + 0.3333333) * fStack_23d0 * fStack_23d0 * fStack_23d0) -
             fStack_23d0 * fStack_23d0 * 0.5);
        uStack_25b0._4_4_ =
             fStack_1fcc * 0.6933594 +
             fStack_23cc +
             ((fStack_1fcc * -0.00021219444 +
              ((((((((fStack_23cc * 0.070376836 + -0.1151461) * fStack_23cc + 0.116769984) *
                    fStack_23cc + -0.12420141) * fStack_23cc + 0.14249323) * fStack_23cc +
                 -0.16668057) * fStack_23cc + 0.20000714) * fStack_23cc + -0.24999994) * fStack_23cc
              + 0.3333333) * fStack_23cc * fStack_23cc * fStack_23cc) -
             fStack_23cc * fStack_23cc * 0.5);
        local_25b8 = local_25b8 | CONCAT44(-(uint)(fVar25 <= 0.0),-(uint)(fVar24 <= 0.0));
        uStack_25b0 = uStack_25b0 | CONCAT44(-(uint)(fVar28 <= 0.0),-(uint)(fVar27 <= 0.0));
        local_26b8 = (float)local_25b8;
        fStack_26b4 = (float)(local_25b8 >> 0x20);
        fStack_26b0 = (float)uStack_25b0;
        fStack_26ac = (float)(uStack_25b0 >> 0x20);
        local_1ce8 = CONCAT44(0.0 - fStack_26b4 * 2.0,0.0 - local_26b8 * 2.0);
        uStack_1ce0._0_4_ = 0.0 - fStack_26b0 * 2.0;
        uStack_1ce0._4_4_ = 0.0 - fStack_26ac * 2.0;
        auVar19._8_8_ = uStack_1ce0;
        auVar19._0_8_ = local_1ce8;
        auVar18._8_8_ = 0x42b0c0a542b0c0a5;
        auVar18._0_8_ = 0x42b0c0a542b0c0a5;
        auVar26 = minps(auVar19,auVar18);
        auVar10._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar10._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar26 = maxps(auVar26,auVar10);
        local_1c88 = auVar26._0_4_;
        fStack_1c84 = auVar26._4_4_;
        fStack_1c80 = auVar26._8_4_;
        fStack_1c7c = auVar26._12_4_;
        fVar24 = local_1c88 * 1.442695 + 0.5;
        fVar27 = fStack_1c84 * 1.442695 + 0.5;
        fVar29 = fStack_1c80 * 1.442695 + 0.5;
        fVar31 = fStack_1c7c * 1.442695 + 0.5;
        fVar25 = (float)(int)fVar24;
        fVar28 = (float)(int)fVar27;
        fVar30 = (float)(int)fVar29;
        fVar32 = (float)(int)fVar31;
        local_1d38 = CONCAT44(-(uint)(fVar27 < fVar28),-(uint)(fVar24 < fVar25));
        uStack_1d30 = CONCAT44(-(uint)(fVar31 < fVar32),-(uint)(fVar29 < fVar30));
        local_1c18 = (float)(local_1d38 & 0x3f8000003f800000);
        fStack_1c14 = (float)((local_1d38 & 0x3f8000003f800000) >> 0x20);
        fStack_1c10 = (float)(uStack_1d30 & 0x3f8000003f800000);
        fStack_1c0c = (float)((uStack_1d30 & 0x3f8000003f800000) >> 0x20);
        fVar25 = fVar25 - local_1c18;
        fVar28 = fVar28 - fStack_1c14;
        fVar30 = fVar30 - fStack_1c10;
        fVar32 = fVar32 - fStack_1c0c;
        fVar24 = (local_1c88 - fVar25 * 0.6933594) - fVar25 * -0.00021219444;
        fVar27 = (fStack_1c84 - fVar28 * 0.6933594) - fVar28 * -0.00021219444;
        fVar29 = (fStack_1c80 - fVar30 * 0.6933594) - fVar30 * -0.00021219444;
        fVar31 = (fStack_1c7c - fVar32 * 0.6933594) - fVar32 * -0.00021219444;
        auVar7._8_8_ = 0x3f8000003f800000;
        auVar7._0_8_ = 0x3f8000003f800000;
        auVar6._4_4_ = ((((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27
                          + 0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5) * fVar27 * fVar27 +
                        fVar27 + 1.0) * (float)((int)fVar28 + 0x7f) + 1.0;
        auVar6._0_4_ = ((((((fVar24 * 0.00019875691 + 0.0013981999) * fVar24 + 0.008333452) * fVar24
                          + 0.041665796) * fVar24 + 0.16666666) * fVar24 + 0.5) * fVar24 * fVar24 +
                        fVar24 + 1.0) * (float)(((int)fVar25 + 0x7f) * 0x800000) + 1.0;
        auVar6._8_4_ = ((((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29
                          + 0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5) * fVar29 * fVar29 +
                        fVar29 + 1.0) * (float)((int)fVar30 + 0x7f) + 1.0;
        auVar6._12_4_ =
             ((((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31 +
                0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5) * fVar31 * fVar31 + fVar31 + 1.0
             ) * (float)((int)fVar32 + 0x7f) + 1.0;
        auVar26 = divps(auVar7,auVar6);
        local_26d8 = auVar26._0_4_;
        fStack_26d4 = auVar26._4_4_;
        fStack_26d0 = auVar26._8_4_;
        fStack_26cc = auVar26._12_4_;
        local_2748 = (float)*(undefined8 *)*local_29a0;
        fStack_2744 = (float)((ulong)*(undefined8 *)*local_29a0 >> 0x20);
        fStack_2740 = (float)*(undefined8 *)(*local_29a0 + 8);
        fStack_273c = (float)((ulong)*(undefined8 *)(*local_29a0 + 8) >> 0x20);
        local_2a08 = CONCAT44(fStack_2744 * (fStack_26d4 * 2.0 - 1.0),
                              local_2748 * (local_26d8 * 2.0 - 1.0));
        uStack_2a00 = CONCAT44(fStack_273c * (fStack_26cc * 2.0 - 1.0),
                               fStack_2740 * (fStack_26d0 * 2.0 - 1.0));
        auVar5._8_8_ = uStack_2a00;
        auVar5._0_8_ = local_2a08;
        *local_29a0 = auVar5;
        local_29a0 = local_29a0 + 1;
      }
    }
  }
  else {
    local_2970 = in_RSI;
    for (local_2a0c = 0; local_2a0c < local_2988; local_2a0c = local_2a0c + 1) {
      local_2948 = &local_2a60;
      local_2814 = *(int *)((long)local_2970 + 0x2c);
      local_2818 = (int)local_2970[6];
      local_281c = *(undefined4 *)((long)local_2970 + 0x34);
      local_2828 = (undefined1 (*) [16])
                   (*local_2970 + local_2970[8] * (long)local_2a0c * local_2970[2]);
      local_2830 = local_2970[2];
      local_2834 = (undefined4)local_2970[3];
      local_2840 = local_2970[4];
      local_2810 = &local_2a60;
      local_2800 = (long)local_2814 * (long)local_2818 * local_2830;
      local_2928 = &local_2a60;
      local_28f8 = &local_2a60;
      local_2804 = 0x10;
      local_2954 = local_2a0c;
      local_2955 = 1;
      local_2a60 = 0;
      local_2a50 = 0;
      local_2a48 = 0;
      local_2a38 = 0;
      local_2a34 = 0;
      local_2a30 = 0;
      local_2a2c = 0;
      local_2a28 = 0;
      local_2a20 = 0;
      local_2a58 = 0;
      local_2a18 = local_2828;
      for (local_2a64 = 0; local_27d0 = local_28f8, local_2a40 = local_2840,
          local_2a64 + 3 < local_298c; local_2a64 = local_2a64 + 4) {
        local_28e8 = local_2a18;
        local_28d8 = *(undefined8 *)*local_2a18;
        uStack_28d0 = *(undefined8 *)(*local_2a18 + 8);
        local_1b58 = 0;
        uStack_1b50 = 0;
        local_24e8 = 0x3f8000003f800000;
        uStack_24e0 = 0x3f8000003f800000;
        local_2b8 = 0x42b0c0a542b0c0a5;
        uStack_2b0 = 0x42b0c0a542b0c0a5;
        auVar22._8_8_ = 0x42b0c0a542b0c0a5;
        auVar22._0_8_ = 0x42b0c0a542b0c0a5;
        auVar26 = minps(*local_2a18,auVar22);
        local_21c8 = auVar26._0_8_;
        local_1a88 = local_21c8;
        uStack_21c0 = auVar26._8_8_;
        uStack_1a80 = uStack_21c0;
        local_1ab8 = 0xc2b0c0a5c2b0c0a5;
        uStack_1ab0 = 0xc2b0c0a5c2b0c0a5;
        auVar12._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar12._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar26 = maxps(auVar26,auVar12);
        local_21c8 = auVar26._0_8_;
        uVar1 = local_21c8;
        uStack_21c0 = auVar26._8_8_;
        uVar2 = uStack_21c0;
        local_2178 = 0x3fb8aa3b3fb8aa3b;
        uStack_2170 = 0x3fb8aa3b3fb8aa3b;
        local_2168._0_4_ = auVar26._0_4_;
        local_2168._4_4_ = auVar26._4_4_;
        uStack_2160._0_4_ = auVar26._8_4_;
        uStack_2160._4_4_ = auVar26._12_4_;
        local_2128 = CONCAT44(local_2168._4_4_ * 1.442695,(float)local_2168 * 1.442695);
        uStack_2120 = CONCAT44(uStack_2160._4_4_ * 1.442695,(float)uStack_2160 * 1.442695);
        local_2138 = 0x3f0000003f000000;
        uStack_2130 = 0x3f0000003f000000;
        fVar24 = (float)local_2168 * 1.442695 + 0.5;
        fVar25 = local_2168._4_4_ * 1.442695 + 0.5;
        fVar27 = (float)uStack_2160 * 1.442695 + 0.5;
        fVar28 = uStack_2160._4_4_ * 1.442695 + 0.5;
        local_208 = CONCAT44(fVar25,fVar24);
        uStack_200 = CONCAT44(fVar28,fVar27);
        local_1798 = CONCAT44((int)fVar25,(int)fVar24);
        uStack_1790 = CONCAT44((int)fVar28,(int)fVar27);
        local_21e8 = (float)(int)fVar24;
        fStack_21e4 = (float)(int)fVar25;
        fStack_21e0 = (float)(int)fVar27;
        fStack_21dc = (float)(int)fVar28;
        local_21d8 = CONCAT44(fStack_21e4,local_21e8);
        uStack_21d0 = CONCAT44(fStack_21dc,fStack_21e0);
        local_188 = local_21d8;
        uStack_180 = uStack_21d0;
        local_198 = CONCAT44(fVar25,fVar24);
        uStack_190 = CONCAT44(fVar28,fVar27);
        local_2218 = CONCAT44(-(uint)(fVar25 < fStack_21e4),-(uint)(fVar24 < local_21e8));
        uStack_2210 = CONCAT44(-(uint)(fVar28 < fStack_21dc),-(uint)(fVar27 < fStack_21e0));
        local_1968 = local_2218;
        uStack_1960 = uStack_2210;
        local_1978 = 0x3f8000003f800000;
        uStack_1970 = 0x3f8000003f800000;
        local_2218 = local_2218 & 0x3f8000003f800000;
        uStack_2210 = uStack_2210 & 0x3f8000003f800000;
        local_2048 = local_21d8;
        uStack_2040 = uStack_21d0;
        local_2058._0_4_ = (float)local_2218;
        local_2058._4_4_ = (float)(local_2218 >> 0x20);
        uStack_2050._0_4_ = (float)uStack_2210;
        uStack_2050._4_4_ = (float)(uStack_2210 >> 0x20);
        local_21e8 = local_21e8 - (float)local_2058;
        fStack_21e4 = fStack_21e4 - local_2058._4_4_;
        fStack_21e0 = fStack_21e0 - (float)uStack_2050;
        fStack_21dc = fStack_21dc - uStack_2050._4_4_;
        local_500 = &local_21e8;
        local_4a8 = ::_ps_cephes_exp_C1;
        local_1290 = &local_21c8;
        local_468 = local_21c8;
        uStack_460 = uStack_21c0;
        local_488 = CONCAT44(fStack_21e4,local_21e8);
        uStack_480 = CONCAT44(fStack_21dc,fStack_21e0);
        local_498[0] = 0.6933594;
        local_498[1] = 0.6933594;
        afStack_490[0] = 0.6933594;
        afStack_490[1] = 0.6933594;
        local_478 = local_21e8 * 0.6933594;
        fStack_474 = fStack_21e4 * 0.6933594;
        fStack_470 = fStack_21e0 * 0.6933594;
        fStack_46c = fStack_21dc * 0.6933594;
        local_21c8 = CONCAT44(local_2168._4_4_ - fStack_474,(float)local_2168 - local_478);
        uStack_21c0._0_4_ = (float)uStack_2160 - fStack_470;
        uStack_21c0._4_4_ = uStack_2160._4_4_ - fStack_46c;
        local_508 = ::_ps_cephes_exp_C2;
        local_4c8 = local_21c8;
        uStack_4c0 = uStack_21c0;
        local_4e8 = CONCAT44(fStack_21e4,local_21e8);
        uStack_4e0 = CONCAT44(fStack_21dc,fStack_21e0);
        local_4f8[0] = -0.00021219444;
        local_4f8[1] = -0.00021219444;
        afStack_4f0[0] = -0.00021219444;
        afStack_4f0[1] = -0.00021219444;
        local_4d8 = local_21e8 * -0.00021219444;
        fStack_4d4 = fStack_21e4 * -0.00021219444;
        fStack_4d0 = fStack_21e0 * -0.00021219444;
        fStack_4cc = fStack_21dc * -0.00021219444;
        fVar24 = ((float)local_2168 - local_478) - local_4d8;
        fVar25 = (local_2168._4_4_ - fStack_474) - fStack_4d4;
        fVar27 = ((float)uStack_2160 - fStack_470) - fStack_4d0;
        fVar28 = (uStack_2160._4_4_ - fStack_46c) - fStack_4cc;
        local_21c8 = CONCAT44(fVar25,fVar24);
        uStack_21c0._0_4_ = fVar27;
        uStack_21c0._4_4_ = fVar28;
        local_2198 = local_21c8;
        uStack_2190 = uStack_21c0;
        local_21d8 = CONCAT44(fVar25 * fVar25,fVar24 * fVar24);
        uStack_21d0 = CONCAT44(fVar28 * fVar28,fVar27 * fVar27);
        local_1280 = &local_2228;
        local_10b0 = ::_ps_cephes_exp_p1;
        local_1088 = 0x3950696739506967;
        uStack_1080 = 0x3950696739506967;
        local_1098 = local_21c8;
        uStack_1090 = uStack_21c0;
        local_1068 = fVar24 * 0.00019875691;
        fStack_1064 = fVar25 * 0.00019875691;
        fStack_1060 = fVar27 * 0.00019875691;
        fStack_105c = fVar28 * 0.00019875691;
        local_1078[0] = 0.0013981999;
        local_1078[1] = 0.0013981999;
        afStack_1070[0] = 0.0013981999;
        afStack_1070[1] = 0.0013981999;
        local_2228 = CONCAT44(fStack_1064 + 0.0013981999,local_1068 + 0.0013981999);
        uStack_2220 = CONCAT44(fStack_105c + 0.0013981999,fStack_1060 + 0.0013981999);
        local_1110 = ::_ps_cephes_exp_p2;
        local_10e8 = local_2228;
        uStack_10e0 = uStack_2220;
        local_10f8 = local_21c8;
        uStack_10f0 = uStack_21c0;
        local_10c8 = (local_1068 + 0.0013981999) * fVar24;
        fStack_10c4 = (fStack_1064 + 0.0013981999) * fVar25;
        fStack_10c0 = (fStack_1060 + 0.0013981999) * fVar27;
        fStack_10bc = (fStack_105c + 0.0013981999) * fVar28;
        local_10d8[0] = 0.008333452;
        local_10d8[1] = 0.008333452;
        afStack_10d0[0] = 0.008333452;
        afStack_10d0[1] = 0.008333452;
        local_2228 = CONCAT44(fStack_10c4 + 0.008333452,local_10c8 + 0.008333452);
        uStack_2220 = CONCAT44(fStack_10bc + 0.008333452,fStack_10c0 + 0.008333452);
        local_1170 = ::_ps_cephes_exp_p3;
        local_1148 = local_2228;
        uStack_1140 = uStack_2220;
        local_1158 = local_21c8;
        uStack_1150 = uStack_21c0;
        local_1128 = (local_10c8 + 0.008333452) * fVar24;
        fStack_1124 = (fStack_10c4 + 0.008333452) * fVar25;
        fStack_1120 = (fStack_10c0 + 0.008333452) * fVar27;
        fStack_111c = (fStack_10bc + 0.008333452) * fVar28;
        local_1138[0] = 0.041665796;
        local_1138[1] = 0.041665796;
        afStack_1130[0] = 0.041665796;
        afStack_1130[1] = 0.041665796;
        local_2228 = CONCAT44(fStack_1124 + 0.041665796,local_1128 + 0.041665796);
        uStack_2220 = CONCAT44(fStack_111c + 0.041665796,fStack_1120 + 0.041665796);
        local_11d0 = ::_ps_cephes_exp_p4;
        local_11a8 = local_2228;
        uStack_11a0 = uStack_2220;
        local_11b8 = local_21c8;
        uStack_11b0 = uStack_21c0;
        local_1188 = (local_1128 + 0.041665796) * fVar24;
        fStack_1184 = (fStack_1124 + 0.041665796) * fVar25;
        fStack_1180 = (fStack_1120 + 0.041665796) * fVar27;
        fStack_117c = (fStack_111c + 0.041665796) * fVar28;
        local_1198[0] = 0.16666666;
        local_1198[1] = 0.16666666;
        afStack_1190[0] = 0.16666666;
        afStack_1190[1] = 0.16666666;
        local_2228 = CONCAT44(fStack_1184 + 0.16666666,local_1188 + 0.16666666);
        uStack_2220 = CONCAT44(fStack_117c + 0.16666666,fStack_1180 + 0.16666666);
        local_1230 = ::_ps_cephes_exp_p5;
        local_1208 = local_2228;
        uStack_1200 = uStack_2220;
        local_1218 = local_21c8;
        uStack_1210 = uStack_21c0;
        local_11e8 = (local_1188 + 0.16666666) * fVar24;
        fStack_11e4 = (fStack_1184 + 0.16666666) * fVar25;
        fStack_11e0 = (fStack_1180 + 0.16666666) * fVar27;
        fStack_11dc = (fStack_117c + 0.16666666) * fVar28;
        local_11f8[0] = 0.5;
        local_11f8[1] = 0.5;
        afStack_11f0[0] = 0.5;
        afStack_11f0[1] = 0.5;
        local_2228 = CONCAT44(fStack_11e4 + 0.5,local_11e8 + 0.5);
        uStack_2220 = CONCAT44(fStack_11dc + 0.5,fStack_11e0 + 0.5);
        local_1288 = &local_21d8;
        local_1268 = local_2228;
        uStack_1260 = uStack_2220;
        local_1278 = local_21d8;
        uStack_1270 = uStack_21d0;
        local_1248 = (local_11e8 + 0.5) * fVar24 * fVar24;
        fStack_1244 = (fStack_11e4 + 0.5) * fVar25 * fVar25;
        fStack_1240 = (fStack_11e0 + 0.5) * fVar27 * fVar27;
        fStack_123c = (fStack_11dc + 0.5) * fVar28 * fVar28;
        local_1258 = local_21c8;
        uStack_1250 = uStack_21c0;
        local_2228 = CONCAT44(fStack_1244 + fVar25,local_1248 + fVar24);
        uStack_2220 = CONCAT44(fStack_123c + fVar28,fStack_1240 + fVar27);
        local_2148 = local_2228;
        uStack_2140 = uStack_2220;
        local_2158 = 0x3f8000003f800000;
        uStack_2150 = 0x3f8000003f800000;
        fVar24 = local_1248 + fVar24 + 1.0;
        fVar25 = fStack_1244 + fVar25 + 1.0;
        fVar27 = fStack_1240 + fVar27 + 1.0;
        fVar28 = fStack_123c + fVar28 + 1.0;
        local_2228 = CONCAT44(fVar25,fVar24);
        uStack_2220 = CONCAT44(fVar28,fVar27);
        local_218 = CONCAT44(fStack_21e4,local_21e8);
        uStack_210 = CONCAT44(fStack_21dc,fStack_21e0);
        local_108 = CONCAT44((int)fStack_21e4,(int)local_21e8);
        uStack_100 = CONCAT44((int)fStack_21dc,(int)fStack_21e0);
        local_17f8 = 0x7f0000007f;
        uStack_17f0 = 0x7f0000007f;
        iVar33 = (int)local_21e8 + 0x7f;
        fStack_21f4 = (float)((int)fStack_21e4 + 0x7f);
        fStack_21f0 = (float)((int)fStack_21e0 + 0x7f);
        fStack_21ec = (float)((int)fStack_21dc + 0x7f);
        local_88 = CONCAT44(fStack_21f4,iVar33);
        uStack_80 = CONCAT44(fStack_21ec,fStack_21f0);
        local_8c = 0x17;
        local_21f8 = (float)(iVar33 * 0x800000);
        local_2238 = CONCAT44(fStack_21f4,local_21f8);
        uStack_2230 = CONCAT44(fStack_21ec,fStack_21f0);
        local_21a8 = local_2228;
        uStack_21a0 = uStack_2220;
        fVar24 = fVar24 * local_21f8;
        fVar25 = fVar25 * fStack_21f4;
        fVar27 = fVar27 * fStack_21f0;
        fVar28 = fVar28 * fStack_21ec;
        local_2228 = CONCAT44(fVar25,fVar24);
        uStack_2220 = CONCAT44(fVar28,fVar27);
        local_2368 = local_2228;
        uStack_2360 = uStack_2220;
        local_205c = 0x3f800000;
        local_2078 = 0x3f800000;
        local_2378 = 0x3f8000003f800000;
        uStack_2370 = 0x3f8000003f800000;
        fVar24 = fVar24 + 1.0;
        fVar25 = fVar25 + 1.0;
        fVar27 = fVar27 + 1.0;
        fVar28 = fVar28 + 1.0;
        local_24c8 = CONCAT44(fVar25,fVar24);
        uStack_24c0._0_4_ = fVar27;
        uStack_24c0._4_4_ = fVar28;
        local_1b08 = local_24c8;
        uStack_1b00 = uStack_24c0;
        local_1b38 = 0;
        uStack_1b30 = 0;
        local_1b18 = 0;
        uStack_1b10 = 0;
        local_24f8 = -(uint)(fVar24 <= 0.0);
        iStack_24f4 = -(uint)(fVar25 <= 0.0);
        iStack_24f0 = -(uint)(fVar27 <= 0.0);
        iStack_24ec = -(uint)(fVar28 <= 0.0);
        local_1a48 = local_24c8;
        uStack_1a40 = uStack_24c0;
        local_1a58 = 0x80000000800000;
        uStack_1a50 = 0x80000000800000;
        auVar15._8_8_ = uStack_24c0;
        auVar15._0_8_ = local_24c8;
        auVar14._8_8_ = 0x80000000800000;
        auVar14._0_8_ = 0x80000000800000;
        auVar26 = maxps(auVar15,auVar14);
        local_24c8 = auVar26._0_8_;
        local_19d8 = local_24c8;
        uStack_24c0 = auVar26._8_8_;
        uStack_19d0 = uStack_24c0;
        uVar34 = local_24c8;
        uVar35 = uStack_24c0;
        local_1a0c = 0x17;
        local_1a08._0_4_ = auVar26._0_4_;
        local_1a08._4_4_ = auVar26._4_4_;
        uStack_1a00._0_4_ = auVar26._8_4_;
        uStack_1a00._4_4_ = auVar26._12_4_;
        local_18e8 = local_24c8;
        uStack_18e0 = uStack_24c0;
        local_18f8 = 0x807fffff807fffff;
        uStack_18f0 = 0x807fffff807fffff;
        local_1848 = local_24c8 & 0x807fffff807fffff;
        uStack_1840 = uStack_24c0 & 0x807fffff807fffff;
        local_1fe8 = local_1848 | 0x3f0000003f000000;
        uStack_1fe0 = uStack_1840 | 0x3f0000003f000000;
        local_17e8 = CONCAT44(local_1a08._4_4_ >> 0x17,(uint)local_1a08 >> 0x17);
        uStack_17e0 = CONCAT44(uStack_1a00._4_4_ >> 0x17,(uint)uStack_1a00 >> 0x17);
        local_24d8 = ((uint)local_1a08 >> 0x17) - 0x7f;
        iStack_24d4 = (local_1a08._4_4_ >> 0x17) - 0x7f;
        iStack_24d0 = ((uint)uStack_1a00 >> 0x17) - 0x7f;
        iStack_24cc = (uStack_1a00._4_4_ >> 0x17) - 0x7f;
        local_1778 = CONCAT44(iStack_24d4,local_24d8);
        uStack_1770 = CONCAT44(iStack_24cc,iStack_24d0);
        local_2408 = CONCAT44((float)iStack_24d4,(float)local_24d8);
        uStack_2400 = CONCAT44((float)iStack_24cc,(float)iStack_24d0);
        local_2418 = 0x3f8000003f800000;
        uStack_2410 = 0x3f8000003f800000;
        local_2508 = (float)local_24d8 + 1.0;
        fStack_2504 = (float)iStack_24d4 + 1.0;
        fStack_2500 = (float)iStack_24d0 + 1.0;
        fStack_24fc = (float)iStack_24cc + 1.0;
        local_1758 = 0x3f3504f33f3504f3;
        uStack_1750 = 0x3f3504f33f3504f3;
        local_1748._0_4_ = (float)local_1fe8;
        local_1748._4_4_ = (float)(local_1fe8 >> 0x20);
        uStack_1740._0_4_ = (float)uStack_1fe0;
        uStack_1740._4_4_ = (float)(uStack_1fe0 >> 0x20);
        local_2518 = -(uint)((float)local_1748 < 0.70710677);
        iStack_2514 = -(uint)(local_1748._4_4_ < 0.70710677);
        iStack_2510 = -(uint)((float)uStack_1740 < 0.70710677);
        iStack_250c = -(uint)(uStack_1740._4_4_ < 0.70710677);
        local_1918 = CONCAT44(iStack_2514,local_2518);
        uStack_1910 = CONCAT44(iStack_250c,iStack_2510);
        local_2528 = local_1fe8 & local_1918;
        uStack_2520 = uStack_1fe0 & uStack_1910;
        local_1ff8 = 0x3f8000003f800000;
        uStack_1ff0 = 0x3f8000003f800000;
        local_24c8 = CONCAT44(local_1748._4_4_ - 1.0,(float)local_1748 - 1.0);
        uStack_24c0._0_4_ = (float)uStack_1740 - 1.0;
        uStack_24c0._4_4_ = uStack_1740._4_4_ - 1.0;
        local_2008 = CONCAT44(fStack_2504,local_2508);
        uStack_2000 = CONCAT44(fStack_24fc,fStack_2500);
        local_1928 = 0x3f8000003f800000;
        uStack_1920 = 0x3f8000003f800000;
        local_1938 = CONCAT44(iStack_2514,local_2518);
        uStack_1930 = CONCAT44(iStack_250c,iStack_2510);
        uVar36 = local_1938 & 0x3f8000003f800000;
        uVar37 = uStack_1930 & 0x3f8000003f800000;
        local_2018._0_4_ = (float)uVar36;
        local_2018._4_4_ = (float)(uVar36 >> 0x20);
        uStack_2010._0_4_ = (float)uVar37;
        uStack_2010._4_4_ = (float)(uVar37 >> 0x20);
        local_2508 = local_2508 - (float)local_2018;
        fStack_2504 = fStack_2504 - local_2018._4_4_;
        fStack_2500 = fStack_2500 - (float)uStack_2010;
        fStack_24fc = fStack_24fc - uStack_2010._4_4_;
        local_2428 = local_24c8;
        uStack_2420 = uStack_24c0;
        local_2438._0_4_ = (float)local_2528;
        local_2438._4_4_ = (float)(local_2528 >> 0x20);
        uStack_2430._0_4_ = (float)uStack_2520;
        uStack_2430._4_4_ = (float)(uStack_2520 >> 0x20);
        local_2438._0_4_ = ((float)local_1748 - 1.0) + (float)local_2438;
        local_2438._4_4_ = (local_1748._4_4_ - 1.0) + local_2438._4_4_;
        uStack_2430._0_4_ = ((float)uStack_1740 - 1.0) + (float)uStack_2430;
        uStack_2430._4_4_ = (uStack_1740._4_4_ - 1.0) + uStack_2430._4_4_;
        local_24c8 = CONCAT44(local_2438._4_4_,(float)local_2438);
        uStack_24c0._0_4_ = (float)uStack_2430;
        uStack_24c0._4_4_ = uStack_2430._4_4_;
        local_2478 = local_24c8;
        uStack_2470 = uStack_24c0;
        local_2538 = (float)local_2438 * (float)local_2438;
        fStack_2534 = local_2438._4_4_ * local_2438._4_4_;
        fStack_2530 = (float)uStack_2430 * (float)uStack_2430;
        fStack_252c = uStack_2430._4_4_ * uStack_2430._4_4_;
        local_db0 = &local_2548;
        local_e10 = &local_24c8;
        local_ab0 = ::_ps_cephes_log_p1;
        local_a88 = 0x3d9021bb3d9021bb;
        uStack_a80 = 0x3d9021bb3d9021bb;
        local_a98 = local_24c8;
        uStack_a90 = uStack_24c0;
        local_a68 = (float)local_2438 * 0.070376836;
        fStack_a64 = local_2438._4_4_ * 0.070376836;
        fStack_a60 = (float)uStack_2430 * 0.070376836;
        fStack_a5c = uStack_2430._4_4_ * 0.070376836;
        local_a78[0] = -0.1151461;
        local_a78[1] = -0.1151461;
        afStack_a70[0] = -0.1151461;
        afStack_a70[1] = -0.1151461;
        local_2548 = CONCAT44(fStack_a64 + -0.1151461,local_a68 + -0.1151461);
        uStack_2540 = CONCAT44(fStack_a5c + -0.1151461,fStack_a60 + -0.1151461);
        local_b10 = ::_ps_cephes_log_p2;
        local_ae8 = local_2548;
        uStack_ae0 = uStack_2540;
        local_af8 = local_24c8;
        uStack_af0 = uStack_24c0;
        local_ac8 = (local_a68 + -0.1151461) * (float)local_2438;
        fStack_ac4 = (fStack_a64 + -0.1151461) * local_2438._4_4_;
        fStack_ac0 = (fStack_a60 + -0.1151461) * (float)uStack_2430;
        fStack_abc = (fStack_a5c + -0.1151461) * uStack_2430._4_4_;
        local_ad8[0] = 0.116769984;
        local_ad8[1] = 0.116769984;
        afStack_ad0[0] = 0.116769984;
        afStack_ad0[1] = 0.116769984;
        local_2548 = CONCAT44(fStack_ac4 + 0.116769984,local_ac8 + 0.116769984);
        uStack_2540 = CONCAT44(fStack_abc + 0.116769984,fStack_ac0 + 0.116769984);
        local_b70 = ::_ps_cephes_log_p3;
        local_b48 = local_2548;
        uStack_b40 = uStack_2540;
        local_b58 = local_24c8;
        uStack_b50 = uStack_24c0;
        local_b28 = (local_ac8 + 0.116769984) * (float)local_2438;
        fStack_b24 = (fStack_ac4 + 0.116769984) * local_2438._4_4_;
        fStack_b20 = (fStack_ac0 + 0.116769984) * (float)uStack_2430;
        fStack_b1c = (fStack_abc + 0.116769984) * uStack_2430._4_4_;
        local_b38[0] = -0.12420141;
        local_b38[1] = -0.12420141;
        afStack_b30[0] = -0.12420141;
        afStack_b30[1] = -0.12420141;
        local_2548 = CONCAT44(fStack_b24 + -0.12420141,local_b28 + -0.12420141);
        uStack_2540 = CONCAT44(fStack_b1c + -0.12420141,fStack_b20 + -0.12420141);
        local_bd0 = ::_ps_cephes_log_p4;
        local_ba8 = local_2548;
        uStack_ba0 = uStack_2540;
        local_bb8 = local_24c8;
        uStack_bb0 = uStack_24c0;
        local_b88 = (local_b28 + -0.12420141) * (float)local_2438;
        fStack_b84 = (fStack_b24 + -0.12420141) * local_2438._4_4_;
        fStack_b80 = (fStack_b20 + -0.12420141) * (float)uStack_2430;
        fStack_b7c = (fStack_b1c + -0.12420141) * uStack_2430._4_4_;
        local_b98[0] = 0.14249323;
        local_b98[1] = 0.14249323;
        afStack_b90[0] = 0.14249323;
        afStack_b90[1] = 0.14249323;
        local_2548 = CONCAT44(fStack_b84 + 0.14249323,local_b88 + 0.14249323);
        uStack_2540 = CONCAT44(fStack_b7c + 0.14249323,fStack_b80 + 0.14249323);
        local_c30 = ::_ps_cephes_log_p5;
        local_c08 = local_2548;
        uStack_c00 = uStack_2540;
        local_c18 = local_24c8;
        uStack_c10 = uStack_24c0;
        local_be8 = (local_b88 + 0.14249323) * (float)local_2438;
        fStack_be4 = (fStack_b84 + 0.14249323) * local_2438._4_4_;
        fStack_be0 = (fStack_b80 + 0.14249323) * (float)uStack_2430;
        fStack_bdc = (fStack_b7c + 0.14249323) * uStack_2430._4_4_;
        local_bf8[0] = -0.16668057;
        local_bf8[1] = -0.16668057;
        afStack_bf0[0] = -0.16668057;
        afStack_bf0[1] = -0.16668057;
        local_2548 = CONCAT44(fStack_be4 + -0.16668057,local_be8 + -0.16668057);
        uStack_2540 = CONCAT44(fStack_bdc + -0.16668057,fStack_be0 + -0.16668057);
        local_c90 = ::_ps_cephes_log_p6;
        local_c68 = local_2548;
        uStack_c60 = uStack_2540;
        local_c78 = local_24c8;
        uStack_c70 = uStack_24c0;
        local_c48 = (local_be8 + -0.16668057) * (float)local_2438;
        fStack_c44 = (fStack_be4 + -0.16668057) * local_2438._4_4_;
        fStack_c40 = (fStack_be0 + -0.16668057) * (float)uStack_2430;
        fStack_c3c = (fStack_bdc + -0.16668057) * uStack_2430._4_4_;
        local_c58[0] = 0.20000714;
        local_c58[1] = 0.20000714;
        afStack_c50[0] = 0.20000714;
        afStack_c50[1] = 0.20000714;
        local_2548 = CONCAT44(fStack_c44 + 0.20000714,local_c48 + 0.20000714);
        uStack_2540 = CONCAT44(fStack_c3c + 0.20000714,fStack_c40 + 0.20000714);
        local_cf0 = ::_ps_cephes_log_p7;
        local_cc8 = local_2548;
        uStack_cc0 = uStack_2540;
        local_cd8 = local_24c8;
        uStack_cd0 = uStack_24c0;
        local_ca8 = (local_c48 + 0.20000714) * (float)local_2438;
        fStack_ca4 = (fStack_c44 + 0.20000714) * local_2438._4_4_;
        fStack_ca0 = (fStack_c40 + 0.20000714) * (float)uStack_2430;
        fStack_c9c = (fStack_c3c + 0.20000714) * uStack_2430._4_4_;
        local_cb8[0] = -0.24999994;
        local_cb8[1] = -0.24999994;
        afStack_cb0[0] = -0.24999994;
        afStack_cb0[1] = -0.24999994;
        local_2548 = CONCAT44(fStack_ca4 + -0.24999994,local_ca8 + -0.24999994);
        uStack_2540 = CONCAT44(fStack_c9c + -0.24999994,fStack_ca0 + -0.24999994);
        local_d50 = ::_ps_cephes_log_p8;
        local_d28 = local_2548;
        uStack_d20 = uStack_2540;
        local_d38 = local_24c8;
        uStack_d30 = uStack_24c0;
        local_d08 = (local_ca8 + -0.24999994) * (float)local_2438;
        fStack_d04 = (fStack_ca4 + -0.24999994) * local_2438._4_4_;
        fStack_d00 = (fStack_ca0 + -0.24999994) * (float)uStack_2430;
        fStack_cfc = (fStack_c9c + -0.24999994) * uStack_2430._4_4_;
        local_d18[0] = 0.3333333;
        local_d18[1] = 0.3333333;
        afStack_d10[0] = 0.3333333;
        afStack_d10[1] = 0.3333333;
        local_2548 = CONCAT44(fStack_d04 + 0.3333333,local_d08 + 0.3333333);
        uStack_2540 = CONCAT44(fStack_cfc + 0.3333333,fStack_d00 + 0.3333333);
        local_2488 = local_2548;
        uStack_2480 = uStack_2540;
        local_2498 = local_24c8;
        uStack_2490 = uStack_24c0;
        fVar24 = (local_d08 + 0.3333333) * (float)local_2438;
        fVar25 = (fStack_d04 + 0.3333333) * local_2438._4_4_;
        fVar27 = (fStack_d00 + 0.3333333) * (float)uStack_2430;
        fVar28 = (fStack_cfc + 0.3333333) * uStack_2430._4_4_;
        local_2548 = CONCAT44(fVar25,fVar24);
        uStack_2540 = CONCAT44(fVar28,fVar27);
        local_24a8 = local_2548;
        uStack_24a0 = uStack_2540;
        local_24b8 = CONCAT44(fStack_2534,local_2538);
        uStack_24b0 = CONCAT44(fStack_252c,fStack_2530);
        fVar24 = fVar24 * local_2538;
        fVar25 = fVar25 * fStack_2534;
        fVar27 = fVar27 * fStack_2530;
        fVar28 = fVar28 * fStack_252c;
        local_2548 = CONCAT44(fVar25,fVar24);
        uStack_2540 = CONCAT44(fVar28,fVar27);
        local_e00 = &local_2508;
        local_da8 = ::_ps_cephes_log_q1;
        local_d88 = CONCAT44(fStack_2504,local_2508);
        uStack_d80 = CONCAT44(fStack_24fc,fStack_2500);
        local_d98[0] = -0.00021219444;
        local_d98[1] = -0.00021219444;
        afStack_d90[0] = -0.00021219444;
        afStack_d90[1] = -0.00021219444;
        local_d68 = local_2508 * -0.00021219444;
        fStack_d64 = fStack_2504 * -0.00021219444;
        fStack_d60 = fStack_2500 * -0.00021219444;
        fStack_d5c = fStack_24fc * -0.00021219444;
        local_d78 = local_2548;
        uStack_d70 = uStack_2540;
        fVar24 = local_d68 + fVar24;
        fVar25 = fStack_d64 + fVar25;
        fVar27 = fStack_d60 + fVar27;
        fVar28 = fStack_d5c + fVar28;
        local_2548 = CONCAT44(fVar25,fVar24);
        uStack_2540 = CONCAT44(fVar28,fVar27);
        local_380 = &local_2538;
        local_388 = ::_ps_0p5;
        local_348 = local_2548;
        uStack_340 = uStack_2540;
        local_368 = CONCAT44(fStack_2534,local_2538);
        uStack_360 = CONCAT44(fStack_252c,fStack_2530);
        local_378[0] = 0.5;
        local_378[1] = 0.5;
        afStack_370[0] = 0.5;
        afStack_370[1] = 0.5;
        local_358 = local_2538 * 0.5;
        fStack_354 = fStack_2534 * 0.5;
        fStack_350 = fStack_2530 * 0.5;
        fStack_34c = fStack_252c * 0.5;
        fVar24 = fVar24 - local_358;
        fVar25 = fVar25 - fStack_354;
        fVar27 = fVar27 - fStack_350;
        fVar28 = fVar28 - fStack_34c;
        local_2548 = CONCAT44(fVar25,fVar24);
        uStack_2540 = CONCAT44(fVar28,fVar27);
        local_2448 = local_24c8;
        uStack_2440 = uStack_24c0;
        local_2458 = local_2548;
        uStack_2450 = uStack_2540;
        local_2438._0_4_ = (float)local_2438 + fVar24;
        local_2438._4_4_ = local_2438._4_4_ + fVar25;
        uStack_2430._0_4_ = (float)uStack_2430 + fVar27;
        uStack_2430._4_4_ = uStack_2430._4_4_ + fVar28;
        local_24c8 = CONCAT44(local_2438._4_4_,(float)local_2438);
        uStack_24c0._0_4_ = (float)uStack_2430;
        uStack_24c0._4_4_ = uStack_2430._4_4_;
        local_e08 = ::_ps_cephes_log_q2;
        local_de8 = CONCAT44(fStack_2504,local_2508);
        uStack_de0 = CONCAT44(fStack_24fc,fStack_2500);
        local_df8[0] = 0.6933594;
        local_df8[1] = 0.6933594;
        afStack_df0[0] = 0.6933594;
        afStack_df0[1] = 0.6933594;
        local_dc8 = local_2508 * 0.6933594;
        fStack_dc4 = fStack_2504 * 0.6933594;
        fStack_dc0 = fStack_2500 * 0.6933594;
        fStack_dbc = fStack_24fc * 0.6933594;
        local_dd8 = local_24c8;
        uStack_dd0 = uStack_24c0;
        local_24c8 = CONCAT44(fStack_dc4 + local_2438._4_4_,local_dc8 + (float)local_2438);
        uStack_24c0._0_4_ = fStack_dc0 + (float)uStack_2430;
        uStack_24c0._4_4_ = fStack_dbc + uStack_2430._4_4_;
        local_1868 = local_24c8;
        uStack_1860 = uStack_24c0;
        local_1878 = CONCAT44(iStack_24f4,local_24f8);
        uStack_1870 = CONCAT44(iStack_24ec,iStack_24f0);
        local_2688 = local_24c8 | local_1878;
        uStack_2680 = uStack_24c0 | uStack_1870;
        uStack_24c0 = uStack_2680;
        local_24c8 = local_2688;
        local_20dc = 0x3f800000;
        local_20f8 = 0x3f800000;
        local_2698 = 0x3f8000003f800000;
        uStack_2690 = 0x3f8000003f800000;
        local_20fc = 0x40000000;
        local_2118 = 0x40000000;
        local_26a8 = 0x4000000040000000;
        uStack_26a0 = 0x4000000040000000;
        local_2648._0_4_ = (float)local_2688;
        local_2648._4_4_ = (float)(local_2688 >> 0x20);
        uStack_2640._0_4_ = (float)uStack_2680;
        uStack_2640._4_4_ = (float)(uStack_2680 >> 0x20);
        local_1f48 = (float)local_2648 * 2.0;
        fStack_1f44 = local_2648._4_4_ * 2.0;
        fStack_1f40 = (float)uStack_2640 * 2.0;
        fStack_1f3c = uStack_2640._4_4_ * 2.0;
        local_1ddc = 0x3f800000;
        local_1df8 = 0x3f800000;
        local_1f58 = 0x3f8000003f800000;
        uStack_1f50 = 0x3f8000003f800000;
        local_1b68 = 0;
        uStack_1b60 = 0;
        local_1da8 = 0;
        uStack_1da0 = 0;
        local_1db8 = CONCAT44(fStack_1f44,local_1f48);
        uStack_1db0 = CONCAT44(fStack_1f3c,fStack_1f40);
        local_1ea8 = CONCAT44(0.0 - fStack_1f44,0.0 - local_1f48);
        uStack_1ea0._0_4_ = 0.0 - fStack_1f40;
        uStack_1ea0._4_4_ = 0.0 - fStack_1f3c;
        local_1b78 = 0;
        uStack_1b70 = 0;
        local_2a8 = local_1ea8;
        uStack_2a0 = uStack_1ea0;
        auVar21._8_8_ = uStack_1ea0;
        auVar21._0_8_ = local_1ea8;
        auVar20._8_8_ = 0x42b0c0a542b0c0a5;
        auVar20._0_8_ = 0x42b0c0a542b0c0a5;
        auVar26 = minps(auVar21,auVar20);
        local_1ea8 = auVar26._0_8_;
        local_1aa8 = local_1ea8;
        uStack_1ea0 = auVar26._8_8_;
        uStack_1aa0 = uStack_1ea0;
        auVar11._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar11._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar26 = maxps(auVar26,auVar11);
        local_1ea8 = auVar26._0_8_;
        uVar3 = local_1ea8;
        uStack_1ea0 = auVar26._8_8_;
        uVar4 = uStack_1ea0;
        local_1e48._0_4_ = auVar26._0_4_;
        local_1e48._4_4_ = auVar26._4_4_;
        uStack_1e40._0_4_ = auVar26._8_4_;
        uStack_1e40._4_4_ = auVar26._12_4_;
        local_1e08 = CONCAT44(local_1e48._4_4_ * 1.442695,(float)local_1e48 * 1.442695);
        uStack_1e00 = CONCAT44(uStack_1e40._4_4_ * 1.442695,(float)uStack_1e40 * 1.442695);
        fVar24 = (float)local_1e48 * 1.442695 + 0.5;
        fVar25 = local_1e48._4_4_ * 1.442695 + 0.5;
        fVar27 = (float)uStack_1e40 * 1.442695 + 0.5;
        fVar28 = uStack_1e40._4_4_ * 1.442695 + 0.5;
        local_228 = CONCAT44(fVar25,fVar24);
        uStack_220 = CONCAT44(fVar28,fVar27);
        local_17a8 = CONCAT44((int)fVar25,(int)fVar24);
        uStack_17a0 = CONCAT44((int)fVar28,(int)fVar27);
        local_1ec8 = (float)(int)fVar24;
        fStack_1ec4 = (float)(int)fVar25;
        fStack_1ec0 = (float)(int)fVar27;
        fStack_1ebc = (float)(int)fVar28;
        local_1a8 = CONCAT44(fStack_1ec4,local_1ec8);
        uStack_1a0 = CONCAT44(fStack_1ebc,fStack_1ec0);
        local_1b8 = CONCAT44(fVar25,fVar24);
        uStack_1b0 = CONCAT44(fVar28,fVar27);
        local_1ef8 = CONCAT44(-(uint)(fVar25 < fStack_1ec4),-(uint)(fVar24 < local_1ec8));
        uStack_1ef0 = CONCAT44(-(uint)(fVar28 < fStack_1ebc),-(uint)(fVar27 < fStack_1ec0));
        local_1988 = local_1ef8;
        uStack_1980 = uStack_1ef0;
        local_1998 = 0x3f8000003f800000;
        uStack_1990 = 0x3f8000003f800000;
        local_1ef8 = local_1ef8 & 0x3f8000003f800000;
        uStack_1ef0 = uStack_1ef0 & 0x3f8000003f800000;
        local_1dc8 = CONCAT44(fStack_1ec4,local_1ec8);
        uStack_1dc0 = CONCAT44(fStack_1ebc,fStack_1ec0);
        local_1dd8._0_4_ = (float)local_1ef8;
        local_1dd8._4_4_ = (float)(local_1ef8 >> 0x20);
        uStack_1dd0._0_4_ = (float)uStack_1ef0;
        uStack_1dd0._4_4_ = (float)(uStack_1ef0 >> 0x20);
        local_1ec8 = local_1ec8 - (float)local_1dd8;
        fStack_1ec4 = fStack_1ec4 - local_1dd8._4_4_;
        fStack_1ec0 = fStack_1ec0 - (float)uStack_1dd0;
        fStack_1ebc = fStack_1ebc - uStack_1dd0._4_4_;
        local_5c0 = &local_1ec8;
        local_568 = ::_ps_cephes_exp_C1;
        local_14d0 = &local_1ea8;
        local_528 = local_1ea8;
        uStack_520 = uStack_1ea0;
        local_548 = CONCAT44(fStack_1ec4,local_1ec8);
        uStack_540 = CONCAT44(fStack_1ebc,fStack_1ec0);
        local_558[0] = 0.6933594;
        local_558[1] = 0.6933594;
        afStack_550[0] = 0.6933594;
        afStack_550[1] = 0.6933594;
        local_538 = local_1ec8 * 0.6933594;
        fStack_534 = fStack_1ec4 * 0.6933594;
        fStack_530 = fStack_1ec0 * 0.6933594;
        fStack_52c = fStack_1ebc * 0.6933594;
        local_1ea8 = CONCAT44(local_1e48._4_4_ - fStack_534,(float)local_1e48 - local_538);
        uStack_1ea0._0_4_ = (float)uStack_1e40 - fStack_530;
        uStack_1ea0._4_4_ = uStack_1e40._4_4_ - fStack_52c;
        local_5c8 = ::_ps_cephes_exp_C2;
        local_588 = local_1ea8;
        uStack_580 = uStack_1ea0;
        local_5a8 = CONCAT44(fStack_1ec4,local_1ec8);
        uStack_5a0 = CONCAT44(fStack_1ebc,fStack_1ec0);
        local_5b8[0] = -0.00021219444;
        local_5b8[1] = -0.00021219444;
        afStack_5b0[0] = -0.00021219444;
        afStack_5b0[1] = -0.00021219444;
        local_598 = local_1ec8 * -0.00021219444;
        fStack_594 = fStack_1ec4 * -0.00021219444;
        fStack_590 = fStack_1ec0 * -0.00021219444;
        fStack_58c = fStack_1ebc * -0.00021219444;
        fVar24 = ((float)local_1e48 - local_538) - local_598;
        fVar25 = (local_1e48._4_4_ - fStack_534) - fStack_594;
        fVar27 = ((float)uStack_1e40 - fStack_530) - fStack_590;
        fVar28 = (uStack_1e40._4_4_ - fStack_52c) - fStack_58c;
        local_1ea8 = CONCAT44(fVar25,fVar24);
        uStack_1ea0._0_4_ = fVar27;
        uStack_1ea0._4_4_ = fVar28;
        local_1e78 = local_1ea8;
        uStack_1e70 = uStack_1ea0;
        local_1eb8 = fVar24 * fVar24;
        fStack_1eb4 = fVar25 * fVar25;
        fStack_1eb0 = fVar27 * fVar27;
        fStack_1eac = fVar28 * fVar28;
        local_14c0 = &local_1f08;
        local_12f0 = ::_ps_cephes_exp_p1;
        local_12c8 = 0x3950696739506967;
        uStack_12c0 = 0x3950696739506967;
        local_12d8 = local_1ea8;
        uStack_12d0 = uStack_1ea0;
        local_12a8 = fVar24 * 0.00019875691;
        fStack_12a4 = fVar25 * 0.00019875691;
        fStack_12a0 = fVar27 * 0.00019875691;
        fStack_129c = fVar28 * 0.00019875691;
        local_12b8[0] = 0.0013981999;
        local_12b8[1] = 0.0013981999;
        afStack_12b0[0] = 0.0013981999;
        afStack_12b0[1] = 0.0013981999;
        local_1f08 = CONCAT44(fStack_12a4 + 0.0013981999,local_12a8 + 0.0013981999);
        uStack_1f00 = CONCAT44(fStack_129c + 0.0013981999,fStack_12a0 + 0.0013981999);
        local_1350 = ::_ps_cephes_exp_p2;
        local_1328 = local_1f08;
        uStack_1320 = uStack_1f00;
        local_1338 = local_1ea8;
        uStack_1330 = uStack_1ea0;
        local_1308 = (local_12a8 + 0.0013981999) * fVar24;
        fStack_1304 = (fStack_12a4 + 0.0013981999) * fVar25;
        fStack_1300 = (fStack_12a0 + 0.0013981999) * fVar27;
        fStack_12fc = (fStack_129c + 0.0013981999) * fVar28;
        local_1318[0] = 0.008333452;
        local_1318[1] = 0.008333452;
        afStack_1310[0] = 0.008333452;
        afStack_1310[1] = 0.008333452;
        local_1f08 = CONCAT44(fStack_1304 + 0.008333452,local_1308 + 0.008333452);
        uStack_1f00 = CONCAT44(fStack_12fc + 0.008333452,fStack_1300 + 0.008333452);
        local_13b0 = ::_ps_cephes_exp_p3;
        local_1388 = local_1f08;
        uStack_1380 = uStack_1f00;
        local_1398 = local_1ea8;
        uStack_1390 = uStack_1ea0;
        local_1368 = (local_1308 + 0.008333452) * fVar24;
        fStack_1364 = (fStack_1304 + 0.008333452) * fVar25;
        fStack_1360 = (fStack_1300 + 0.008333452) * fVar27;
        fStack_135c = (fStack_12fc + 0.008333452) * fVar28;
        local_1378[0] = 0.041665796;
        local_1378[1] = 0.041665796;
        afStack_1370[0] = 0.041665796;
        afStack_1370[1] = 0.041665796;
        local_1f08 = CONCAT44(fStack_1364 + 0.041665796,local_1368 + 0.041665796);
        uStack_1f00 = CONCAT44(fStack_135c + 0.041665796,fStack_1360 + 0.041665796);
        local_1410 = ::_ps_cephes_exp_p4;
        local_13e8 = local_1f08;
        uStack_13e0 = uStack_1f00;
        local_13f8 = local_1ea8;
        uStack_13f0 = uStack_1ea0;
        local_13c8 = (local_1368 + 0.041665796) * fVar24;
        fStack_13c4 = (fStack_1364 + 0.041665796) * fVar25;
        fStack_13c0 = (fStack_1360 + 0.041665796) * fVar27;
        fStack_13bc = (fStack_135c + 0.041665796) * fVar28;
        local_13d8[0] = 0.16666666;
        local_13d8[1] = 0.16666666;
        afStack_13d0[0] = 0.16666666;
        afStack_13d0[1] = 0.16666666;
        local_1f08 = CONCAT44(fStack_13c4 + 0.16666666,local_13c8 + 0.16666666);
        uStack_1f00 = CONCAT44(fStack_13bc + 0.16666666,fStack_13c0 + 0.16666666);
        local_1470 = ::_ps_cephes_exp_p5;
        local_1448 = local_1f08;
        uStack_1440 = uStack_1f00;
        local_1458 = local_1ea8;
        uStack_1450 = uStack_1ea0;
        local_1428 = (local_13c8 + 0.16666666) * fVar24;
        fStack_1424 = (fStack_13c4 + 0.16666666) * fVar25;
        fStack_1420 = (fStack_13c0 + 0.16666666) * fVar27;
        fStack_141c = (fStack_13bc + 0.16666666) * fVar28;
        local_1438[0] = 0.5;
        local_1438[1] = 0.5;
        afStack_1430[0] = 0.5;
        afStack_1430[1] = 0.5;
        local_1f08 = CONCAT44(fStack_1424 + 0.5,local_1428 + 0.5);
        uStack_1f00 = CONCAT44(fStack_141c + 0.5,fStack_1420 + 0.5);
        local_14c8 = &local_1eb8;
        local_14a8 = local_1f08;
        uStack_14a0 = uStack_1f00;
        local_14b8 = CONCAT44(fStack_1eb4,local_1eb8);
        uStack_14b0 = CONCAT44(fStack_1eac,fStack_1eb0);
        local_1488 = (local_1428 + 0.5) * local_1eb8;
        fStack_1484 = (fStack_1424 + 0.5) * fStack_1eb4;
        fStack_1480 = (fStack_1420 + 0.5) * fStack_1eb0;
        fStack_147c = (fStack_141c + 0.5) * fStack_1eac;
        local_1498 = local_1ea8;
        uStack_1490 = uStack_1ea0;
        local_1f08 = CONCAT44(fStack_1484 + fVar25,local_1488 + fVar24);
        uStack_1f00 = CONCAT44(fStack_147c + fVar28,fStack_1480 + fVar27);
        local_1e28 = local_1f08;
        uStack_1e20 = uStack_1f00;
        local_1e38 = 0x3f8000003f800000;
        uStack_1e30 = 0x3f8000003f800000;
        local_1bb8 = local_1488 + fVar24 + 1.0;
        fStack_1bb4 = fStack_1484 + fVar25 + 1.0;
        fStack_1bb0 = fStack_1480 + fVar27 + 1.0;
        fStack_1bac = fStack_147c + fVar28 + 1.0;
        local_1f08 = CONCAT44(fStack_1bb4,local_1bb8);
        uStack_1f00 = CONCAT44(fStack_1bac,fStack_1bb0);
        local_238 = CONCAT44(fStack_1ec4,local_1ec8);
        uStack_230 = CONCAT44(fStack_1ebc,fStack_1ec0);
        local_128 = CONCAT44((int)fStack_1ec4,(int)local_1ec8);
        uStack_120 = CONCAT44((int)fStack_1ebc,(int)fStack_1ec0);
        iVar33 = (int)local_1ec8 + 0x7f;
        fStack_1ed4 = (float)((int)fStack_1ec4 + 0x7f);
        fStack_1ed0 = (float)((int)fStack_1ec0 + 0x7f);
        fStack_1ecc = (float)((int)fStack_1ebc + 0x7f);
        local_a8 = CONCAT44(fStack_1ed4,iVar33);
        uStack_a0 = CONCAT44(fStack_1ecc,fStack_1ed0);
        local_ac = 0x17;
        local_1ed8 = (float)(iVar33 * 0x800000);
        local_1f18 = CONCAT44(fStack_1ed4,local_1ed8);
        uStack_1f10 = CONCAT44(fStack_1ecc,fStack_1ed0);
        local_1e88 = local_1f08;
        uStack_1e80 = uStack_1f00;
        local_1bb8 = local_1bb8 * local_1ed8;
        fStack_1bb4 = fStack_1bb4 * fStack_1ed4;
        fStack_1bb0 = fStack_1bb0 * fStack_1ed0;
        fStack_1bac = fStack_1bac * fStack_1ecc;
        local_1f08 = CONCAT44(fStack_1bb4,local_1bb8);
        uStack_1f00 = CONCAT44(fStack_1bac,fStack_1bb0);
        local_1f38 = local_1f08;
        uStack_1f30 = uStack_1f00;
        local_1bb8 = local_1bb8 + 1.0;
        fStack_1bb4 = fStack_1bb4 + 1.0;
        fStack_1bb0 = fStack_1bb0 + 1.0;
        fStack_1bac = fStack_1bac + 1.0;
        auVar9._8_8_ = 0x3f8000003f800000;
        auVar9._0_8_ = 0x3f8000003f800000;
        auVar8._4_4_ = fStack_1bb4;
        auVar8._0_4_ = local_1bb8;
        auVar8._8_4_ = fStack_1bb0;
        auVar8._12_4_ = fStack_1bac;
        _local_2668 = divps(auVar9,auVar8);
        local_1f88 = (float)local_2668._0_4_ * 2.0;
        fStack_1f84 = (float)local_2668._4_4_ * 2.0;
        fStack_1f80 = fStack_2660 * 2.0;
        fStack_1f7c = fStack_265c * 2.0;
        local_2738 = local_1f88 - 1.0;
        fStack_2734 = fStack_1f84 - 1.0;
        fStack_2730 = fStack_1f80 - 1.0;
        fStack_272c = fStack_1f7c - 1.0;
        local_2728._0_4_ = (float)local_28d8;
        local_2728._4_4_ = (float)((ulong)local_28d8 >> 0x20);
        uStack_2720._0_4_ = (float)uStack_28d0;
        uStack_2720._4_4_ = (float)((ulong)uStack_28d0 >> 0x20);
        local_2a78 = CONCAT44(local_2728._4_4_ * fStack_2734,(float)local_2728 * local_2738);
        uStack_2a70 = CONCAT44(uStack_2720._4_4_ * fStack_272c,(float)uStack_2720 * fStack_2730);
        local_28a0 = local_2a18;
        local_28b8 = local_2a78;
        uStack_28b0 = uStack_2a70;
        auVar26._8_8_ = uStack_2a70;
        auVar26._0_8_ = local_2a78;
        *local_2a18 = auVar26;
        local_2a18 = local_2a18 + 1;
        local_2728 = local_28d8;
        uStack_2720 = uStack_28d0;
        local_2678 = local_26a8;
        uStack_2670 = uStack_26a0;
        local_2658 = local_26a8;
        uStack_2650 = uStack_26a0;
        local_2648 = local_2688;
        uStack_2640 = uStack_2680;
        local_2468 = local_2478;
        uStack_2460 = uStack_2470;
        local_2438 = local_2528;
        uStack_2430 = uStack_2520;
        local_2208 = local_24e8;
        uStack_2200 = uStack_24e0;
        local_21b8 = local_2238;
        uStack_21b0 = uStack_2230;
        local_2188 = local_2198;
        uStack_2180 = uStack_2190;
        local_2168 = uVar1;
        uStack_2160 = uVar2;
        uStack_2114 = local_2118;
        uStack_2110 = local_2118;
        uStack_210c = local_2118;
        uStack_20f4 = local_20f8;
        uStack_20f0 = local_20f8;
        uStack_20ec = local_20f8;
        uStack_2074 = local_2078;
        uStack_2070 = local_2078;
        uStack_206c = local_2078;
        local_2058 = local_2218;
        uStack_2050 = uStack_2210;
        local_2018 = uVar36;
        uStack_2010 = uVar37;
        local_1f98 = local_2698;
        uStack_1f90 = uStack_2690;
        local_1f28 = local_1f58;
        uStack_1f20 = uStack_1f50;
        local_1ee8 = local_24e8;
        uStack_1ee0 = uStack_24e0;
        local_1e98 = local_1f18;
        uStack_1e90 = uStack_1f10;
        local_1e68 = local_1e78;
        uStack_1e60 = uStack_1e70;
        local_1e58 = local_2178;
        uStack_1e50 = uStack_2170;
        local_1e48 = uVar3;
        uStack_1e40 = uVar4;
        local_1e18 = local_2138;
        uStack_1e10 = uStack_2130;
        uStack_1df4 = local_1df8;
        uStack_1df0 = local_1df8;
        uStack_1dec = local_1df8;
        local_1dd8 = local_1ef8;
        uStack_1dd0 = uStack_1ef0;
        local_1ba8 = local_1f58;
        uStack_1ba0 = uStack_1f50;
        local_1a98 = local_1ab8;
        uStack_1a90 = uStack_1ab0;
        local_1a08 = uVar34;
        uStack_1a00 = uVar35;
        local_1908 = local_1fe8;
        uStack_1900 = uStack_1fe0;
        local_1858 = local_2138;
        uStack_1850 = uStack_2130;
        local_1748 = local_1fe8;
        uStack_1740 = uStack_1fe0;
        local_1468 = local_14d0;
        local_1460 = local_14c0;
        local_1408 = local_14d0;
        local_1400 = local_14c0;
        local_13a8 = local_14d0;
        local_13a0 = local_14c0;
        local_1348 = local_14d0;
        local_1340 = local_14c0;
        local_12e8 = local_14d0;
        local_12e0 = local_14c0;
        local_1228 = local_1290;
        local_1220 = local_1280;
        local_11c8 = local_1290;
        local_11c0 = local_1280;
        local_1168 = local_1290;
        local_1160 = local_1280;
        local_1108 = local_1290;
        local_1100 = local_1280;
        local_10a8 = local_1290;
        local_10a0 = local_1280;
        local_da0 = local_e00;
        local_d48 = local_e10;
        local_d40 = local_db0;
        local_ce8 = local_e10;
        local_ce0 = local_db0;
        local_c88 = local_e10;
        local_c80 = local_db0;
        local_c28 = local_e10;
        local_c20 = local_db0;
        local_bc8 = local_e10;
        local_bc0 = local_db0;
        local_b68 = local_e10;
        local_b60 = local_db0;
        local_b08 = local_e10;
        local_b00 = local_db0;
        local_aa8 = local_e10;
        local_aa0 = local_db0;
        local_5d0 = local_14d0;
        local_570 = local_14d0;
        local_560 = local_5c0;
        local_510 = local_1290;
        local_4b0 = local_1290;
        local_4a0 = local_500;
        local_390 = local_db0;
        local_298 = local_2b8;
        uStack_290 = uStack_2b0;
        local_288 = local_28d8;
        uStack_280 = uStack_28d0;
        local_138 = local_17f8;
        uStack_130 = uStack_17f0;
        local_118 = local_17f8;
        uStack_110 = uStack_17f0;
        local_48 = local_1f18;
        uStack_40 = uStack_1f10;
        local_38 = local_2238;
        uStack_30 = uStack_2230;
      }
      for (; local_2a64 < local_298c; local_2a64 = local_2a64 + 1) {
        fVar24 = *(float *)*local_2a18;
        fVar25 = expf(*(float *)*local_2a18);
        fVar25 = logf(fVar25 + 1.0);
        fVar25 = tanhf(fVar25);
        *(float *)*local_2a18 = fVar24 * fVar25;
        local_2a18 = (undefined1 (*) [16])(*local_2a18 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int Mish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanhf(logf(expf(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}